

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImFontGlyphRangesBuilder::BuildRanges
          (ImFontGlyphRangesBuilder *this,ImVector<unsigned_short> *out_ranges)

{
  int iVar1;
  unsigned_short *puVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  
  uVar4 = 0;
  do {
    uVar6 = uVar4;
    if ((*(uint *)(*(long *)(this + 8) + (long)((int)uVar4 >> 5) * 4) >> (uVar4 & 0x1f) & 1) != 0) {
      iVar3 = out_ranges->Size;
      if (iVar3 == out_ranges->Capacity) {
        if (iVar3 == 0) {
          iVar1 = 8;
        }
        else {
          iVar1 = iVar3 / 2 + iVar3;
        }
        iVar5 = iVar3 + 1;
        if (iVar3 + 1 < iVar1) {
          iVar5 = iVar1;
        }
        puVar2 = (unsigned_short *)ImGui::MemAlloc((long)iVar5 * 2);
        if (out_ranges->Data != (unsigned_short *)0x0) {
          memcpy(puVar2,out_ranges->Data,(long)out_ranges->Size * 2);
          ImGui::MemFree(out_ranges->Data);
        }
        out_ranges->Data = puVar2;
        out_ranges->Capacity = iVar5;
        iVar3 = out_ranges->Size;
      }
      else {
        puVar2 = out_ranges->Data;
      }
      puVar2[iVar3] = (unsigned_short)uVar4;
      iVar1 = out_ranges->Size;
      iVar3 = iVar1 + 1;
      out_ranges->Size = iVar3;
      do {
        uVar6 = uVar4;
        if (uVar6 == 0x10000) break;
        uVar4 = uVar6 + 1;
      } while ((*(uint *)(*(long *)(this + 8) + (long)((int)uVar4 >> 5) * 4) >> (uVar4 & 0x1f) & 1)
               != 0);
      if (iVar3 == out_ranges->Capacity) {
        if (iVar3 == 0) {
          iVar3 = 8;
        }
        else {
          iVar3 = iVar3 / 2 + iVar3;
        }
        iVar1 = iVar1 + 2;
        if (iVar1 < iVar3) {
          iVar1 = iVar3;
        }
        puVar2 = (unsigned_short *)ImGui::MemAlloc((long)iVar1 * 2);
        if (out_ranges->Data != (unsigned_short *)0x0) {
          memcpy(puVar2,out_ranges->Data,(long)out_ranges->Size * 2);
          ImGui::MemFree(out_ranges->Data);
        }
        out_ranges->Data = puVar2;
        out_ranges->Capacity = iVar1;
        iVar3 = out_ranges->Size;
      }
      else {
        puVar2 = out_ranges->Data;
      }
      puVar2[iVar3] = (unsigned_short)uVar6;
      out_ranges->Size = out_ranges->Size + 1;
    }
    uVar4 = uVar6 + 1;
    if (0xfffe < (int)uVar6) {
      iVar3 = out_ranges->Size;
      if (iVar3 == out_ranges->Capacity) {
        if (iVar3 == 0) {
          iVar1 = 8;
        }
        else {
          iVar1 = iVar3 / 2 + iVar3;
        }
        iVar5 = iVar3 + 1;
        if (iVar3 + 1 < iVar1) {
          iVar5 = iVar1;
        }
        puVar2 = (unsigned_short *)ImGui::MemAlloc((long)iVar5 * 2);
        if (out_ranges->Data != (unsigned_short *)0x0) {
          memcpy(puVar2,out_ranges->Data,(long)out_ranges->Size * 2);
          ImGui::MemFree(out_ranges->Data);
        }
        out_ranges->Data = puVar2;
        out_ranges->Capacity = iVar5;
        iVar3 = out_ranges->Size;
      }
      else {
        puVar2 = out_ranges->Data;
      }
      puVar2[iVar3] = 0;
      out_ranges->Size = out_ranges->Size + 1;
      return;
    }
  } while( true );
}

Assistant:

void ImFontGlyphRangesBuilder::BuildRanges(ImVector<ImWchar>* out_ranges)
{
    for (int n = 0; n < 0x10000; n++)
        if (GetBit(n))
        {
            out_ranges->push_back((ImWchar)n);
            while (n < 0x10000 && GetBit(n + 1))
                n++;
            out_ranges->push_back((ImWchar)n);
        }
    out_ranges->push_back(0);
}